

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O2

bool __thiscall
BamTools::BamAlignment::GetSoftClips
          (BamAlignment *this,vector<int,_std::allocator<int>_> *clipSizes,
          vector<int,_std::allocator<int>_> *readPositions,
          vector<int,_std::allocator<int>_> *genomePositions,bool usePadded)

{
  pointer pCVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  undefined3 in_register_00000081;
  pointer pCVar5;
  int readPosition;
  int refPosition;
  value_type_conflict1 local_40;
  int local_3c;
  undefined4 local_38;
  uint32_t local_34;
  
  local_38 = CONCAT31(in_register_00000081,usePadded);
  local_3c = this->Position;
  local_40 = 0;
  pCVar1 = (this->CigarData).
           super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar3 = true;
  bVar2 = false;
  for (pCVar5 = (this->CigarData).
                super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
                super__Vector_impl_data._M_start; pCVar5 != pCVar1; pCVar5 = pCVar5 + 1) {
    uVar4 = (byte)pCVar5->Type - 0x3d;
    if (uVar4 < 0x1c) {
      if ((0x8030081U >> (uVar4 & 0x1f) & 1) == 0) {
        if (uVar4 == 0xc) {
          local_40 = local_40 + pCVar5->Length;
          if ((char)local_38 != '\0') {
            local_3c = local_3c + pCVar5->Length;
          }
        }
        else if (uVar4 == 0x16) {
          local_34 = pCVar5->Length;
          if (bVar3) {
            local_40 = local_40 + local_34;
          }
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(clipSizes,(int *)&local_34);
          std::vector<int,_std::allocator<int>_>::push_back(readPositions,&local_40);
          std::vector<int,_std::allocator<int>_>::push_back(genomePositions,&local_3c);
          bVar2 = true;
        }
      }
      else {
        local_3c = local_3c + pCVar5->Length;
        local_40 = local_40 + pCVar5->Length;
      }
    }
    bVar3 = false;
  }
  return bVar2;
}

Assistant:

bool BamAlignment::GetSoftClips(std::vector<int>& clipSizes, std::vector<int>& readPositions,
                                std::vector<int>& genomePositions, bool usePadded) const
{
    // initialize positions & flags
    int refPosition = Position;
    int readPosition = 0;
    bool softClipFound = false;
    bool firstCigarOp = true;

    // iterate over cigar operations
    std::vector<CigarOp>::const_iterator cigarIter = CigarData.begin();
    std::vector<CigarOp>::const_iterator cigarEnd = CigarData.end();
    for (; cigarIter != cigarEnd; ++cigarIter) {
        const CigarOp& op = (*cigarIter);

        switch (op.Type) {

            // increase both read & genome positions on CIGAR chars [DMXN=]
            case Constants::BAM_CIGAR_DEL_CHAR:
            case Constants::BAM_CIGAR_MATCH_CHAR:
            case Constants::BAM_CIGAR_MISMATCH_CHAR:
            case Constants::BAM_CIGAR_REFSKIP_CHAR:
            case Constants::BAM_CIGAR_SEQMATCH_CHAR:
                refPosition += op.Length;
                readPosition += op.Length;
                break;

            // increase read position on insertion, genome position only if @usePadded is true
            case Constants::BAM_CIGAR_INS_CHAR:
                readPosition += op.Length;
                if (usePadded) refPosition += op.Length;
                break;

            case Constants::BAM_CIGAR_SOFTCLIP_CHAR:

                softClipFound = true;

                //////////////////////////////////////////////////////////////////////////////
                // if we are dealing with the *first* CIGAR operation
                // for this alignment, we increment the read position so that
                // the read and genome position of the clip are referring to the same base.
                // For example, in the alignment below, the ref position would be 4, yet
                //              the read position would be 0. Thus, to "sync" the two,
                //              we need to increment the read position by the length of the
                //              soft clip.
                // Read:  ATCGTTTCGTCCCTGC
                // Ref:   GGGATTTCGTCCCTGC
                // Cigar: SSSSMMMMMMMMMMMM
                //
                // NOTE: This only needs to be done if the soft clip is the _first_ CIGAR op.
                //////////////////////////////////////////////////////////////////////////////
                if (firstCigarOp) readPosition += op.Length;

                // track the soft clip's size, read position, and genome position
                clipSizes.push_back(op.Length);
                readPositions.push_back(readPosition);
                genomePositions.push_back(refPosition);

            // any other CIGAR operations have no effect
            default:
                break;
        }

        // clear our "first pass" flag
        firstCigarOp = false;
    }

    // return whether any soft clips found
    return softClipFound;
}